

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O2

void rgb_rgb565D_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                        JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  JSAMPLE *pJVar4;
  uint uVar5;
  ulong uVar6;
  ushort *puVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte *pbVar14;
  uint local_54;
  int local_50;
  JSAMPARRAY local_48;
  
  pJVar4 = cinfo->sample_range_limit;
  uVar8 = cinfo->output_width;
  uVar6 = dither_matrix[cinfo->output_scanline & 3];
  local_54 = input_row;
  local_50 = num_rows;
  local_48 = output_buf;
  while (0 < local_50) {
    uVar10 = (ulong)local_54;
    pbVar13 = (*input_buf)[uVar10];
    pbVar12 = input_buf[1][uVar10];
    pbVar14 = input_buf[2][uVar10];
    puVar7 = (ushort *)*local_48;
    if (((ulong)puVar7 & 3) != 0) {
      bVar1 = *pbVar13;
      pbVar13 = pbVar13 + 1;
      uVar10 = uVar6 & 0xff;
      bVar2 = *pbVar12;
      pbVar12 = pbVar12 + 1;
      bVar3 = *pbVar14;
      pbVar14 = pbVar14 + 1;
      *puVar7 = (ushort)(pJVar4[bVar3 + uVar10] >> 3) |
                (pJVar4[bVar1 + uVar10] & 0xfff8) * 0x100 +
                (pJVar4[(ulong)bVar2 + (uVar10 >> 1)] & 0xfc) * 8;
      puVar7 = puVar7 + 1;
      uVar8 = uVar8 - 1;
    }
    local_50 = local_50 + -1;
    local_54 = local_54 + 1;
    local_48 = local_48 + 1;
    for (lVar9 = 0; uVar8 >> 1 != (uint)lVar9; lVar9 = lVar9 + 1) {
      uVar10 = uVar6 & 0xff;
      uVar5 = (uint)(uVar6 >> 8);
      uVar11 = uVar6 >> 8 & 0xff;
      uVar6 = (ulong)(uVar5 << 0x18 | (uVar5 & 0xffff00 | (int)uVar6 << 0x18) >> 8);
      *(uint *)(puVar7 + lVar9 * 2) =
           ((uint)(pJVar4[pbVar14[lVar9 * 2 + 1] + uVar11] >> 3) |
           (pJVar4[pbVar13[lVar9 * 2 + 1] + uVar11] & 0xf8) * 0x100 +
           (pJVar4[(ulong)pbVar12[lVar9 * 2 + 1] + (uVar11 >> 1)] & 0xfc) * 8) << 0x10 |
           (uint)(pJVar4[pbVar14[lVar9 * 2] + uVar10] >> 3) |
           (pJVar4[pbVar13[lVar9 * 2] + uVar10] & 0xf8) * 0x100 +
           (pJVar4[(ulong)pbVar12[lVar9 * 2] + (uVar10 >> 1)] & 0xfc) * 8;
    }
    if ((uVar8 & 1) != 0) {
      uVar10 = uVar6 & 0xff;
      puVar7[lVar9 * 2] =
           (ushort)(pJVar4[pbVar14[lVar9 * 2] + uVar10] >> 3) |
           (pJVar4[pbVar13[lVar9 * 2] + uVar10] & 0xfff8) * 0x100 +
           (pJVar4[(ulong)pbVar12[lVar9 * 2] + (uVar10 >> 1)] & 0xfc) * 8;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_rgb565D_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                    JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  if (is_big_endian())
    rgb_rgb565D_convert_be(cinfo, input_buf, input_row, output_buf, num_rows);
  else
    rgb_rgb565D_convert_le(cinfo, input_buf, input_row, output_buf, num_rows);
}